

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_nand_i32_s390x(TCGContext_conflict12 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  tcg_gen_and_i32(tcg_ctx,ret,arg1,arg2);
  tcg_gen_not_i32(tcg_ctx,ret,ret);
  return;
}

Assistant:

void tcg_gen_nand_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_nand_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_nand_i32, ret, arg1, arg2);
    } else {
        tcg_gen_and_i32(tcg_ctx, ret, arg1, arg2);
        tcg_gen_not_i32(tcg_ctx, ret, ret);
    }
}